

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PanicHandler.cpp
# Opt level: O1

char * xercesc_4_0::PanicHandler::getPanicReasonString(PanicReasons reason)

{
  if (reason < PanicReasons_Count) {
    return &DAT_0035d32c + *(int *)(&DAT_0035d32c + (ulong)reason * 4);
  }
  return "Unknown reason";
}

Assistant:

const char* PanicHandler::getPanicReasonString(const PanicReasons reason)
{
    const char* reasonStr;

    switch (reason)
    {
    case Panic_NoTransService:
        reasonStr = "Could not load a transcoding service";
        break;
    case Panic_NoDefTranscoder:
        reasonStr = "Could not load a local code page transcoder";
        break;
    case Panic_CantFindLib:
        reasonStr = "Could not find the xerces-c DLL";
        break;
    case Panic_UnknownMsgDomain:
        reasonStr = "Unknown message domain";
        break;
    case Panic_CantLoadMsgDomain:
        reasonStr = "Cannot load message domain";
        break;
    case Panic_SynchronizationErr:
        reasonStr = "Cannot synchronize system or mutex";
        break;
    case Panic_SystemInit:
        reasonStr = "Cannot initialize the system or mutex";
        break;
    case Panic_MutexErr:
        reasonStr = "Cannot create, lock or unlock a mutex";
        break;
    default:
        reasonStr = "Unknown reason";
        break;
    }	

    return reasonStr;

}